

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.c
# Opt level: O0

_Bool rtree_new(rtree_t *rtree,_Bool zeroed)

{
  _Bool _Var1;
  undefined1 in_SIL;
  char *in_RDI;
  malloc_mutex_lock_order_t in_stack_ffffffffffffffe8;
  undefined3 in_stack_ffffffffffffffec;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  _Var1 = malloc_mutex_init((malloc_mutex_t *)
                            CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI,
                            CONCAT13(in_SIL,in_stack_ffffffffffffffec) & 0x1ffffff,
                            in_stack_ffffffffffffffe8);
  return _Var1;
}

Assistant:

bool
rtree_new(rtree_t *rtree, bool zeroed) {
#ifdef JEMALLOC_JET
	if (!zeroed) {
		memset(rtree, 0, sizeof(rtree_t)); /* Clear root. */
	}
#else
	assert(zeroed);
#endif

	if (malloc_mutex_init(&rtree->init_lock, "rtree", WITNESS_RANK_RTREE,
	    malloc_mutex_rank_exclusive)) {
		return true;
	}

	return false;
}